

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void P_DoCrunch(AActor *thing,FChangePosition *cpos)

{
  FChangePosition *pFVar1;
  AActor *type;
  bool bVar2;
  uint uVar3;
  uint32 uVar4;
  DWORD DVar5;
  int iVar6;
  int local_b4;
  FSoundID local_94;
  TAngle<double> local_90;
  DVector3 local_88;
  TAngle<double> local_70;
  DAngle an;
  DVector3 local_60;
  AActor *local_48;
  AActor *mo;
  PClassActor *bloodcls;
  PalEntry bloodcolor;
  TFlags<ActorFlag2,_unsigned_int> local_2c;
  TAngle<double> local_28;
  FName local_20;
  int local_1c;
  FChangePosition *pFStack_18;
  int newdam;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  if ((((thing != (AActor *)0x0) &&
       (pFStack_18 = cpos, cpos_local = (FChangePosition *)thing,
       uVar3 = (*(thing->super_DThinker).super_DObject._vptr_DObject[0x18])(thing,1),
       pFVar1 = cpos_local, (uVar3 & 1) != 0)) && (pFStack_18 != (FChangePosition *)0x0)) &&
     ((pFStack_18->nofit = true, 0 < pFStack_18->crushchange && ((level.maptime & 3U) == 0)))) {
    iVar6 = pFStack_18->crushchange;
    FName::FName(&local_20,NAME_Crush);
    TAngle<double>::TAngle(&local_28,0.0);
    local_1c = P_DamageMobj((AActor *)pFVar1,(AActor *)0x0,(AActor *)0x0,iVar6,&local_20,0,&local_28
                           );
    pFVar1 = cpos_local + 0x12;
    operator|((EnumType)&bloodcolor,MF2_INVULNERABLE);
    TFlags<ActorFlag2,_unsigned_int>::operator&(&local_2c,(Self *)&pFVar1->crushchange);
    uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
    if (uVar3 == 0) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                ((TFlags<ActorFlag,_unsigned_int> *)((long)&bloodcls + 4),
                 (int)cpos_local +
                 (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|MF_SHOOTABLE))
      ;
      uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&bloodcls + 4));
      if (uVar3 == 0) {
        bloodcls._0_4_ =
             (anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0)
             AActor::GetBloodColor((AActor *)cpos_local);
        mo = (AActor *)AActor::GetBloodType((AActor *)cpos_local,0);
        if (local_1c < 1) {
          local_b4 = pFStack_18->crushchange;
        }
        else {
          local_b4 = local_1c;
        }
        P_TraceBleed(local_b4,(AActor *)cpos_local);
        type = mo;
        if (mo != (AActor *)0x0) {
          AActor::PosPlusZ(&local_60,(AActor *)cpos_local,(double)cpos_local[0x10].sector / 2.0);
          local_48 = Spawn((PClassActor *)type,&local_60,ALLOW_REPLACE);
          iVar6 = FRandom::Random2(&pr_crunch);
          (local_48->Vel).X = (double)iVar6 / 16.0;
          iVar6 = FRandom::Random2(&pr_crunch);
          (local_48->Vel).Y = (double)iVar6 / 16.0;
          uVar4 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&bloodcls);
          bVar2 = false;
          if (uVar4 != 0) {
            TFlags<ActorFlag2,_unsigned_int>::operator&
                      ((TFlags<ActorFlag2,_unsigned_int> *)((long)&an.Degrees + 4),
                       (int)local_48 + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
            uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)((long)&an.Degrees + 4));
            bVar2 = uVar3 == 0;
          }
          if (bVar2) {
            DVar5 = TRANSLATION('\b',bloodcls._0_4_ >> 0x18);
            local_48->Translation = DVar5;
          }
          iVar6 = FIntCVar::operator_cast_to_int(&cl_bloodtype);
          if (1 < iVar6) {
            TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&local_48->renderflags,RF_INVISIBLE);
          }
        }
        iVar6 = FRandom::operator()(&M_Random);
        TAngle<double>::TAngle(&local_70,(double)(iVar6 + -0x80) * 1.40625);
        iVar6 = FIntCVar::operator_cast_to_int(&cl_bloodtype);
        if (0 < iVar6) {
          AActor::PosPlusZ(&local_88,(AActor *)cpos_local,(double)cpos_local[0x10].sector / 2.0);
          TAngle<double>::TAngle(&local_90,&local_70);
          uVar4 = PalEntry::operator_cast_to_unsigned_int((PalEntry *)&bloodcls);
          P_DrawSplash2(0x20,&local_88,&local_90,2,uVar4);
        }
      }
      bVar2 = FSoundID::operator!=((FSoundID *)((long)&cpos_local[0x29].moveamt + 4),0);
      pFVar1 = cpos_local;
      if (bVar2) {
        iVar6 = FSoundID::operator_cast_to_int((FSoundID *)((long)&cpos_local[0x29].moveamt + 4));
        bVar2 = S_GetSoundPlayingInfo((AActor *)pFVar1,iVar6);
        pFVar1 = cpos_local;
        if (!bVar2) {
          FSoundID::FSoundID(&local_94,(FSoundID *)((long)&cpos_local[0x29].moveamt + 4));
          S_Sound((AActor *)pFVar1,2,&local_94,1.0,1.0);
        }
      }
    }
  }
  return;
}

Assistant:

void P_DoCrunch(AActor *thing, FChangePosition *cpos)
{
	if (!(thing && thing->Grind(true) && cpos)) return;
	cpos->nofit = true;

	if ((cpos->crushchange > 0) && !(level.maptime & 3))
	{
		int newdam = P_DamageMobj(thing, NULL, NULL, cpos->crushchange, NAME_Crush);

		// spray blood in a random direction
		if (!(thing->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
		{
			if (!(thing->flags&MF_NOBLOOD))
			{
				PalEntry bloodcolor = thing->GetBloodColor();
				PClassActor *bloodcls = thing->GetBloodType();
				
				P_TraceBleed (newdam > 0 ? newdam : cpos->crushchange, thing);
				if (bloodcls != NULL)
				{
					AActor *mo;

					mo = Spawn(bloodcls, thing->PosPlusZ(thing->Height / 2), ALLOW_REPLACE);

					mo->Vel.X = pr_crunch.Random2() / 16.;
					mo->Vel.Y = pr_crunch.Random2() / 16.;
					if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
					{
						mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
					}

					if (!(cl_bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
				}

				DAngle an = (M_Random() - 128) * (360./256);
				if (cl_bloodtype >= 1)
				{
					P_DrawSplash2(32,  thing->PosPlusZ(thing->Height/2), an, 2, bloodcolor);
				}
			}
			if (thing->CrushPainSound != 0 && !S_GetSoundPlayingInfo(thing, thing->CrushPainSound))
			{
				S_Sound(thing, CHAN_VOICE, thing->CrushPainSound, 1.f, ATTN_NORM);
			}
		}
	}

	// keep checking (crush other things)
	return;
}